

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O3

int GetVersionSeanet(SEANET *pSeanet)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  uint uVar3;
  ulong uVar4;
  uchar reqbuf [14];
  uchar databuf [25];
  undefined6 uStack_60;
  undefined2 local_5a;
  undefined6 uStack_58;
  int local_4c;
  uchar local_48 [40];
  
  uStack_58 = 0xa0280170302;
  uStack_60 = 0x83830303040;
  local_5a = 0xff00;
  iVar1 = (pSeanet->RS232Port).DevType;
  __s = "Error writing data to a Seanet. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&uStack_60 + uVar4),(ulong)(0xe - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001a15e5;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 0xe);
  }
  else {
    if (iVar1 != 0) goto LAB_001a15e5;
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&uStack_60 + uVar4),(ulong)(0xe - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_001a15e5;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 0xe);
  }
  local_48[0x10] = 0;
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = 0;
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_4c = 0;
  iVar1 = GetLatestMsgSeanet(pSeanet,1,local_48,0x19,&local_4c);
  if (iVar1 == 0) {
    return 0;
  }
  __s = "A Seanet is not responding correctly. ";
LAB_001a15e5:
  puts(__s);
  return 1;
}

Assistant:

inline int GetVersionSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendVersion,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[25];
	int nbdatabytes = 0;

	// Send mtSendVersion message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtVersionData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMsgSeanet(pSeanet, mtVersionData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}